

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ECDecoding.cpp
# Opt level: O3

SeqEntry * __thiscall
ECdecoding::checkCandidate
          (SeqEntry *__return_storage_ptr__,ECdecoding *this,SeqEntry *can,unsigned_long threshold)

{
  pointer pSVar1;
  pointer pSVar2;
  ulong uVar3;
  SeqEntry *bestCan;
  pointer other;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  std::vector<SeqEntry,_std::allocator<SeqEntry>_>::push_back(&this->candidates,can);
  pSVar1 = (this->candidates).super__Vector_base<SeqEntry,_std::allocator<SeqEntry>_>._M_impl.
           super__Vector_impl_data._M_finish;
  other = (this->candidates).super__Vector_base<SeqEntry,_std::allocator<SeqEntry>_>._M_impl.
          super__Vector_impl_data._M_start;
  uVar3 = ((long)pSVar1 - (long)other >> 5) * -0x79435e50d79435e5;
  if (uVar3 < threshold || uVar3 - threshold == 0) {
    this->endFailed = true;
    other = can;
  }
  else {
    pSVar2 = other + 1;
    if (pSVar2 != pSVar1 && other != pSVar1) {
      auVar5._8_8_ = 0;
      auVar5._0_8_ = other->metric;
      do {
        auVar6._8_8_ = 0;
        auVar6._0_8_ = pSVar2->metric;
        dVar4 = auVar5._0_8_;
        auVar5 = vminsd_avx(auVar6,auVar5);
        if (pSVar2->metric < dVar4) {
          other = pSVar2;
        }
        pSVar2 = pSVar2 + 1;
      } while (pSVar2 != pSVar1);
    }
  }
  SeqEntry::SeqEntry(__return_storage_ptr__,other);
  return __return_storage_ptr__;
}

Assistant:

SeqEntry ECdecoding::checkCandidate(SeqEntry &can, unsigned long threshold) {
    candidates.push_back(can);
    if (candidates.size() > threshold) {
        SeqEntry bestCan = *min_element(candidates.begin(), candidates.end());
        DEBUG("Final candidate: " << bestCan.seq);
        return bestCan;
    } else {
        endFailed = true;
        return can;
    }
}